

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O2

token_code get_token_code(string *token)

{
  bool bVar1;
  token_code tVar2;
  
  bVar1 = std::operator==(token,"-ka");
  if (bVar1) {
    tVar2 = ambient;
  }
  else {
    bVar1 = std::operator==(token,"-kd");
    if (bVar1) {
      tVar2 = diffuse;
    }
    else {
      bVar1 = std::operator==(token,"-ks");
      if (bVar1) {
        tVar2 = specular;
      }
      else {
        bVar1 = std::operator==(token,"-spu");
        if (bVar1) {
          tVar2 = set_pu;
        }
        else {
          bVar1 = std::operator==(token,"-spv");
          if (bVar1) {
            tVar2 = set_pv;
          }
          else {
            bVar1 = std::operator==(token,"-sp");
            if (bVar1) {
              tVar2 = set_p;
            }
            else {
              bVar1 = std::operator==(token,"-dl");
              if (bVar1) {
                tVar2 = add_dl;
              }
              else {
                bVar1 = std::operator==(token,"-pl");
                if (bVar1) {
                  tVar2 = add_pl;
                }
                else {
                  bVar1 = std::operator==(token,"-toon");
                  if (bVar1) {
                    tVar2 = toon;
                  }
                  else {
                    bVar1 = std::operator==(token,"-toonl");
                    if (bVar1) {
                      tVar2 = set_toon_layers;
                    }
                    else {
                      bVar1 = std::operator==(token,"-transludepth");
                      if (bVar1) {
                        tVar2 = set_depth;
                      }
                      else {
                        bVar1 = std::operator==(token,"-transludd");
                        if (bVar1) {
                          tVar2 = set_dd;
                        }
                        else {
                          bVar1 = std::operator==(token,"-transluds");
                          if (bVar1) {
                            tVar2 = set_ds;
                          }
                          else {
                            bVar1 = std::operator==(token,"-sketch");
                            tVar2 = set_sketch;
                            if (!bVar1) {
                              tVar2 = not_specified;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return tVar2;
}

Assistant:

token_code get_token_code(string const& token){
    if (token == "-ka") return ambient;
    if (token == "-kd") return diffuse;
    if (token == "-ks") return specular;
    if (token == "-spu") return set_pu;
    if (token == "-spv") return set_pv;
    if (token == "-sp") return set_p;
    if (token == "-dl") return add_dl;
    if (token == "-pl") return add_pl;
    if (token == "-toon") return toon;
    if (token == "-toonl") return set_toon_layers;
    if (token == "-transludepth") return set_depth;
    if (token == "-transludd") return set_dd;
    if (token == "-transluds") return set_ds;
    if (token == "-sketch") return set_sketch;
    return not_specified;
}